

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

LogSeverity jbcoin::Logs::fromString(string *s)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  long lVar4;
  size_type sVar5;
  ulong uVar6;
  pointer pcVar7;
  char *pcVar8;
  string *Input;
  is_iequal local_60;
  locale local_58 [8];
  string *local_50;
  ulong local_48;
  locale local_40 [8];
  locale local_38 [8];
  
  std::locale::locale(local_58);
  std::locale::locale(&local_60.m_Loc,local_58);
  pcVar1 = (s->_M_dataplus)._M_p;
  sVar2 = s->_M_string_length;
  pcVar7 = pcVar1;
  local_50 = s;
  if (sVar2 == 0) {
    bVar3 = false;
  }
  else {
    local_48 = sVar2 - 1;
    uVar6 = 4;
    if (local_48 < 4) {
      uVar6 = local_48;
    }
    lVar4 = uVar6 + 1;
    pcVar8 = "trace";
    do {
      bVar3 = boost::algorithm::is_iequal::operator()(&local_60,pcVar7,pcVar8);
      if (!bVar3) {
        std::locale::~locale(&local_60.m_Loc);
        std::locale::~locale(local_58);
        Input = local_50;
        goto LAB_001bcedf;
      }
      pcVar7 = pcVar7 + 1;
      pcVar8 = pcVar8 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    bVar3 = 3 < local_48;
  }
  Input = local_50;
  std::locale::~locale(&local_60.m_Loc);
  std::locale::~locale(local_58);
  if ((bool)(pcVar7 == pcVar1 + sVar2 & bVar3)) {
    return lsTRACE;
  }
LAB_001bcedf:
  std::locale::locale(local_58);
  std::locale::locale(&local_60.m_Loc,local_58);
  pcVar1 = (Input->_M_dataplus)._M_p;
  sVar2 = Input->_M_string_length;
  pcVar7 = pcVar1;
  if (sVar2 == 0) {
    bVar3 = false;
  }
  else {
    local_48 = sVar2 - 1;
    uVar6 = 4;
    if (local_48 < 4) {
      uVar6 = local_48;
    }
    lVar4 = uVar6 + 1;
    pcVar8 = "debug";
    do {
      bVar3 = boost::algorithm::is_iequal::operator()(&local_60,pcVar7,pcVar8);
      if (!bVar3) {
        std::locale::~locale(&local_60.m_Loc);
        std::locale::~locale(local_58);
        Input = local_50;
        goto LAB_001bcfa6;
      }
      pcVar7 = pcVar7 + 1;
      pcVar8 = pcVar8 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    bVar3 = 3 < local_48;
    Input = local_50;
  }
  std::locale::~locale(&local_60.m_Loc);
  std::locale::~locale(local_58);
  if ((bool)(pcVar7 == pcVar1 + sVar2 & bVar3)) {
    return lsDEBUG;
  }
LAB_001bcfa6:
  std::locale::locale(local_58);
  std::locale::locale(&local_60.m_Loc,local_58);
  sVar2 = Input->_M_string_length;
  if (sVar2 == 0) {
    std::locale::~locale(&local_60.m_Loc);
  }
  else {
    pcVar1 = (Input->_M_dataplus)._M_p;
    local_48 = sVar2 - 1;
    uVar6 = 3;
    if (local_48 < 3) {
      uVar6 = local_48;
    }
    sVar5 = 0;
    do {
      bVar3 = boost::algorithm::is_iequal::operator()(&local_60,pcVar1 + sVar5,"info" + sVar5);
      if (!bVar3) {
        std::locale::~locale(&local_60.m_Loc);
        Input = local_50;
        goto LAB_001bd068;
      }
      sVar5 = sVar5 + 1;
    } while (uVar6 + 1 != sVar5);
    bVar3 = 2 < local_48;
    std::locale::~locale(&local_60.m_Loc);
    Input = local_50;
    if (sVar2 == sVar5 && bVar3) {
      std::locale::~locale(local_58);
      return lsINFO;
    }
  }
LAB_001bd068:
  std::locale::locale(local_40);
  std::locale::locale(&local_60.m_Loc,local_40);
  pcVar1 = (Input->_M_dataplus)._M_p;
  sVar2 = Input->_M_string_length;
  pcVar7 = pcVar1;
  if (sVar2 == 0) {
    bVar3 = false;
  }
  else {
    local_48 = sVar2 - 1;
    uVar6 = 10;
    if (local_48 < 10) {
      uVar6 = local_48;
    }
    lVar4 = uVar6 + 1;
    pcVar8 = "information";
    do {
      bVar3 = boost::algorithm::is_iequal::operator()(&local_60,pcVar7,pcVar8);
      if (!bVar3) {
        std::locale::~locale(&local_60.m_Loc);
        std::locale::~locale(local_40);
        std::locale::~locale(local_58);
        Input = local_50;
        goto LAB_001bd143;
      }
      pcVar7 = pcVar7 + 1;
      pcVar8 = pcVar8 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    bVar3 = 9 < local_48;
    Input = local_50;
  }
  std::locale::~locale(&local_60.m_Loc);
  std::locale::~locale(local_40);
  std::locale::~locale(local_58);
  if ((bool)(pcVar7 == pcVar1 + sVar2 & bVar3)) {
    return lsINFO;
  }
LAB_001bd143:
  std::locale::locale(local_58);
  std::locale::locale(&local_60.m_Loc,local_58);
  sVar2 = Input->_M_string_length;
  if (sVar2 == 0) {
    std::locale::~locale(&local_60.m_Loc);
  }
  else {
    pcVar1 = (Input->_M_dataplus)._M_p;
    local_48 = sVar2 - 1;
    uVar6 = 3;
    if (local_48 < 3) {
      uVar6 = local_48;
    }
    sVar5 = 0;
    do {
      bVar3 = boost::algorithm::is_iequal::operator()(&local_60,pcVar1 + sVar5,"warn" + sVar5);
      if (!bVar3) {
        std::locale::~locale(&local_60.m_Loc);
        Input = local_50;
        goto LAB_001bd1f1;
      }
      sVar5 = sVar5 + 1;
    } while (uVar6 + 1 != sVar5);
    bVar3 = 2 < local_48;
    std::locale::~locale(&local_60.m_Loc);
    Input = local_50;
    if (sVar2 == sVar5 && bVar3) goto LAB_001bd28d;
  }
LAB_001bd1f1:
  std::locale::locale(local_40);
  std::locale::locale(&local_60.m_Loc,local_40);
  sVar2 = Input->_M_string_length;
  if (sVar2 == 0) {
    std::locale::~locale(&local_60.m_Loc);
  }
  else {
    pcVar1 = (Input->_M_dataplus)._M_p;
    local_48 = sVar2 - 1;
    uVar6 = 6;
    if (local_48 < 6) {
      uVar6 = local_48;
    }
    sVar5 = 0;
    do {
      bVar3 = boost::algorithm::is_iequal::operator()(&local_60,pcVar1 + sVar5,"warning" + sVar5);
      if (!bVar3) {
        std::locale::~locale(&local_60.m_Loc);
        Input = local_50;
        goto LAB_001bd2bd;
      }
      sVar5 = sVar5 + 1;
    } while (uVar6 + 1 != sVar5);
    bVar3 = 5 < local_48;
    std::locale::~locale(&local_60.m_Loc);
    Input = local_50;
    if (sVar2 == sVar5 && bVar3) {
      std::locale::~locale(local_40);
LAB_001bd28d:
      std::locale::~locale(local_58);
      return lsWARNING;
    }
  }
LAB_001bd2bd:
  std::locale::locale(local_38);
  std::locale::locale(&local_60.m_Loc,local_38);
  pcVar1 = (Input->_M_dataplus)._M_p;
  sVar2 = Input->_M_string_length;
  pcVar7 = pcVar1;
  if (sVar2 == 0) {
    bVar3 = false;
  }
  else {
    local_48 = sVar2 - 1;
    uVar6 = 7;
    if (local_48 < 7) {
      uVar6 = local_48;
    }
    lVar4 = uVar6 + 1;
    pcVar8 = "warnings";
    do {
      bVar3 = boost::algorithm::is_iequal::operator()(&local_60,pcVar7,pcVar8);
      if (!bVar3) {
        std::locale::~locale(&local_60.m_Loc);
        std::locale::~locale(local_38);
        std::locale::~locale(local_40);
        std::locale::~locale(local_58);
        Input = local_50;
        goto LAB_001bd3ac;
      }
      pcVar7 = pcVar7 + 1;
      pcVar8 = pcVar8 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    bVar3 = 6 < local_48;
    Input = local_50;
  }
  std::locale::~locale(&local_60.m_Loc);
  std::locale::~locale(local_38);
  std::locale::~locale(local_40);
  std::locale::~locale(local_58);
  if ((bool)(pcVar7 == pcVar1 + sVar2 & bVar3)) {
    return lsWARNING;
  }
LAB_001bd3ac:
  std::locale::locale(local_58);
  std::locale::locale(&local_60.m_Loc,local_58);
  sVar2 = Input->_M_string_length;
  if (sVar2 == 0) {
    std::locale::~locale(&local_60.m_Loc);
  }
  else {
    pcVar1 = (Input->_M_dataplus)._M_p;
    local_48 = sVar2 - 1;
    uVar6 = 4;
    if (local_48 < 4) {
      uVar6 = local_48;
    }
    sVar5 = 0;
    do {
      bVar3 = boost::algorithm::is_iequal::operator()
                        (&local_60,pcVar1 + sVar5,"field deserialization error" + sVar5 + 0x16);
      if (!bVar3) {
        std::locale::~locale(&local_60.m_Loc);
        Input = local_50;
        goto LAB_001bd46e;
      }
      sVar5 = sVar5 + 1;
    } while (uVar6 + 1 != sVar5);
    bVar3 = 3 < local_48;
    std::locale::~locale(&local_60.m_Loc);
    Input = local_50;
    if (sVar2 == sVar5 && bVar3) {
      std::locale::~locale(local_58);
      return lsERROR;
    }
  }
LAB_001bd46e:
  std::locale::locale(local_40);
  std::locale::locale(&local_60.m_Loc,local_40);
  pcVar1 = (Input->_M_dataplus)._M_p;
  sVar2 = Input->_M_string_length;
  pcVar7 = pcVar1;
  if (sVar2 == 0) {
    bVar3 = false;
  }
  else {
    local_48 = sVar2 - 1;
    uVar6 = 5;
    if (local_48 < 5) {
      uVar6 = local_48;
    }
    lVar4 = uVar6 + 1;
    pcVar8 = "errors";
    do {
      bVar3 = boost::algorithm::is_iequal::operator()(&local_60,pcVar7,pcVar8);
      if (!bVar3) {
        std::locale::~locale(&local_60.m_Loc);
        std::locale::~locale(local_40);
        std::locale::~locale(local_58);
        Input = local_50;
        goto LAB_001bd549;
      }
      pcVar7 = pcVar7 + 1;
      pcVar8 = pcVar8 + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    bVar3 = 4 < local_48;
    Input = local_50;
  }
  std::locale::~locale(&local_60.m_Loc);
  std::locale::~locale(local_40);
  std::locale::~locale(local_58);
  if ((bool)(pcVar7 == pcVar1 + sVar2 & bVar3)) {
    return lsERROR;
  }
LAB_001bd549:
  std::locale::locale(local_58);
  std::locale::locale(&local_60.m_Loc,local_58);
  sVar2 = Input->_M_string_length;
  if (sVar2 == 0) {
    std::locale::~locale(&local_60.m_Loc);
  }
  else {
    pcVar1 = (Input->_M_dataplus)._M_p;
    local_48 = sVar2 - 1;
    uVar6 = 4;
    if (local_48 < 4) {
      uVar6 = local_48;
    }
    sVar5 = 0;
    do {
      bVar3 = boost::algorithm::is_iequal::operator()(&local_60,pcVar1 + sVar5,"fatal" + sVar5);
      if (!bVar3) {
        std::locale::~locale(&local_60.m_Loc);
        Input = local_50;
        goto LAB_001bd5fe;
      }
      sVar5 = sVar5 + 1;
    } while (uVar6 + 1 != sVar5);
    bVar3 = 3 < local_48;
    std::locale::~locale(&local_60.m_Loc);
    Input = local_50;
    if (sVar2 == sVar5 && bVar3) {
      std::locale::~locale(local_58);
      return lsFATAL;
    }
  }
LAB_001bd5fe:
  std::locale::locale(&local_60.m_Loc);
  bVar3 = boost::algorithm::iequals<std::__cxx11::string,char[7]>
                    (Input,(char (*) [7])"fatals",&local_60.m_Loc);
  std::locale::~locale(&local_60.m_Loc);
  std::locale::~locale(local_58);
  if (bVar3) {
    return lsFATAL;
  }
  return lsINVALID;
}

Assistant:

LogSeverity
Logs::fromString (std::string const& s)
{
    if (boost::iequals (s, "trace"))
        return lsTRACE;

    if (boost::iequals (s, "debug"))
        return lsDEBUG;

    if (boost::iequals (s, "info") || boost::iequals (s, "information"))
        return lsINFO;

    if (boost::iequals (s, "warn") || boost::iequals (s, "warning") || boost::iequals (s, "warnings"))
        return lsWARNING;

    if (boost::iequals (s, "error") || boost::iequals (s, "errors"))
        return lsERROR;

    if (boost::iequals (s, "fatal") || boost::iequals (s, "fatals"))
        return lsFATAL;

    return lsINVALID;
}